

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_util.cc
# Opt level: O0

size_t __thiscall upb::fuzz::anon_unknown_0::Builder::NextLink(Builder *this)

{
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  Builder *this_local;
  
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->input_->links);
  if (bVar2) {
    this_local = (Builder *)0x0;
  }
  else {
    sVar1 = this->link_;
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->input_->links);
    if (sVar1 == sVar3) {
      this->link_ = 0;
    }
    sVar1 = this->link_;
    this->link_ = sVar1 + 1;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->input_->links,sVar1);
    this_local = (Builder *)(ulong)*pvVar4;
  }
  return (size_t)this_local;
}

Assistant:

size_t NextLink() {
    if (input_->links.empty()) return 0;
    if (link_ == input_->links.size()) link_ = 0;
    return input_->links[link_++];
  }